

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

void __thiscall
slang::ast::DistExpression::serializeTo(DistExpression *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer pDVar2;
  pointer pDVar3;
  Expression **ppEVar4;
  string_view name;
  string_view name_00;
  
  ASTSerializer::write(serializer,4,"left",(size_t)this->left_);
  name._M_str = "items";
  name._M_len = 5;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->items_)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pDVar2 = (this->items_)._M_ptr;
    ppEVar4 = &(pDVar2->weight).
               super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
               _M_value.expr;
    do {
      ASTSerializer::startObject(serializer);
      ASTSerializer::write(serializer,5,"value",(size_t)ppEVar4[-2]);
      if ((char)ppEVar4[1] == '\x01') {
        ASTSerializer::write(serializer,4,"kind",8);
        ASTSerializer::write(serializer,6,"weight",(size_t)*ppEVar4);
      }
      ASTSerializer::endObject(serializer);
      pDVar3 = (pointer)(ppEVar4 + 2);
      ppEVar4 = ppEVar4 + 4;
    } while (pDVar3 != pDVar2 + sVar1);
  }
  ASTSerializer::endArray(serializer);
  if ((this->defaultWeight_).
      super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged != false) {
    name_00._M_str = "defaultWeight";
    name_00._M_len = 0xd;
    ASTSerializer::writeProperty(serializer,name_00);
    ASTSerializer::startObject(serializer);
    ASTSerializer::write(serializer,4,"kind",8);
    ASTSerializer::write
              (serializer,6,"weight",
               (size_t)(this->defaultWeight_).
                       super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                       _M_payload.
                       super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                       _M_payload._M_value.expr);
    ASTSerializer::endObject(serializer);
    return;
  }
  return;
}

Assistant:

void DistExpression::serializeTo(ASTSerializer& serializer) const {
    auto writeWeight = [&](const DistWeight& weight) {
        serializer.write("kind", weight.kind == DistWeight::PerRange ? "PerRange"sv : "PerValue"sv);
        serializer.write("weight", *weight.expr);
    };

    serializer.write("left", left());
    serializer.startArray("items");
    for (auto& item : items_) {
        serializer.startObject();
        serializer.write("value", item.value);
        if (item.weight)
            writeWeight(*item.weight);
        serializer.endObject();
    }
    serializer.endArray();

    if (defaultWeight_) {
        serializer.writeProperty("defaultWeight");
        serializer.startObject();
        writeWeight(*defaultWeight_);
        serializer.endObject();
    }
}